

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitSelect(WasmBytecodeGenerator *this)

{
  EmitInfo EVar1;
  bool bVar2;
  OpCodeAsmJs OVar3;
  RegSlot location_;
  uint uVar4;
  uint uVar5;
  WasmRegisterSpace *this_00;
  OpCodeAsmJs loadOp;
  ByteCodeLabel doneLabel;
  ByteCodeLabel falseLabel;
  WasmType selectType;
  EmitInfo trueInfo;
  EmitInfo falseInfo;
  EmitInfo conditionInfo;
  WasmBytecodeGenerator *this_local;
  EmitInfo resultInfo;
  
  falseInfo = PopEvalStack(this,FirstLocalType,L"select condition must have i32 type");
  trueInfo = PopValuePolymorphic(this);
  _falseLabel = PopEvalStack(this,trueInfo.type,L"select operands must both have same type");
  ReleaseLocation(this,&falseInfo);
  ReleaseLocation(this,&trueInfo);
  ReleaseLocation(this,(EmitInfo *)&falseLabel);
  bVar2 = IsUnreachable(this);
  if (bVar2) {
    if (selectType == Any) {
      EmitInfo::EmitInfo((EmitInfo *)&this_local,&trueInfo.type);
    }
    else {
      EmitInfo::EmitInfo((EmitInfo *)&this_local,&selectType);
    }
  }
  else {
    doneLabel = selectType;
    this_00 = GetRegisterSpace(this,selectType);
    location_ = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
    EmitInfo::EmitInfo((EmitInfo *)&this_local,location_,(WasmType *)&doneLabel);
    uVar4 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
    uVar5 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
    OVar3 = GetLoadOp(this,this_local._4_4_);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1a])
              (this->m_writer,0x27,(ulong)uVar4,(ulong)falseInfo & 0xffffffff);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)OVar3,(ulong)this_local._0_4_,(ulong)_falseLabel & 0xffffffff);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])(this->m_writer,(ulong)uVar5,0x25);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)uVar4);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)OVar3,(ulong)this_local._0_4_,(ulong)trueInfo & 0xffffffff);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)uVar5);
  }
  EVar1.type = this_local._4_4_;
  EVar1.super_EmitInfoBase.location = this_local._0_4_;
  return EVar1;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitSelect()
{
    EmitInfo conditionInfo = PopEvalStack(WasmTypes::I32, _u("select condition must have i32 type"));
    EmitInfo falseInfo = PopValuePolymorphic();
    EmitInfo trueInfo = PopEvalStack(falseInfo.type, _u("select operands must both have same type"));
    ReleaseLocation(&conditionInfo);
    ReleaseLocation(&falseInfo);
    ReleaseLocation(&trueInfo);

    if (IsUnreachable())
    {
        if (trueInfo.type == WasmTypes::Any)
        {
            // Report the type of falseInfo for type checking
            return EmitInfo(falseInfo.type);
        }
        // Otherwise report the type of trueInfo for type checking
        return EmitInfo(trueInfo.type);
    }
    WasmTypes::WasmType selectType = trueInfo.type;
    EmitInfo resultInfo = EmitInfo(GetRegisterSpace(selectType)->AcquireTmpRegister(), selectType);

    Js::ByteCodeLabel falseLabel = m_writer->DefineLabel();
    Js::ByteCodeLabel doneLabel = m_writer->DefineLabel();
    Js::OpCodeAsmJs loadOp = GetLoadOp(resultInfo.type);


    // var result;
    // if (!condition) goto:condFalse
    // result = trueRes;
    // goto:done;
    //:condFalse
    // result = falseRes;
    //:done
    m_writer->AsmBrReg1(Js::OpCodeAsmJs::BrFalse_Int, falseLabel, conditionInfo.location);
    m_writer->AsmReg2(loadOp, resultInfo.location, trueInfo.location);
    m_writer->AsmBr(doneLabel);
    m_writer->MarkAsmJsLabel(falseLabel);
    m_writer->AsmReg2(loadOp, resultInfo.location, falseInfo.location);
    m_writer->MarkAsmJsLabel(doneLabel);

    return resultInfo;
}